

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O2

void __thiscall gvr::Mesh::saveSTL(Mesh *this,char *name)

{
  float *pfVar1;
  long lVar2;
  int i;
  int iVar3;
  char cVar4;
  uint *puVar5;
  float s;
  SVector<float,_3> local_448;
  SVector<float,_3> local_438;
  Mesh *local_428;
  Vector3f local_420 [3];
  SVector<float,_3> local_3fc;
  SVector<float,_3> local_3f0;
  Vector3f vn;
  Vector6d pose;
  ostringstream header;
  undefined8 local_3a0 [46];
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
  std::ofstream::open((char *)&out,(_Ios_Openmode)name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&header);
  std::operator<<((ostream *)&header,"campose=");
  gmath::getPose(&pose,&(this->super_PointCloud).super_Model.Rc,
                 &(this->super_PointCloud).super_Model.Tc);
  *(undefined8 *)((long)local_3a0 + *(long *)(_header + -0x18)) = 5;
  gmath::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&header,&pose);
  while( true ) {
    lVar2 = std::ostream::tellp();
    if (0x4f < lVar2) break;
    std::operator<<((ostream *)&header,' ');
  }
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)&out,local_420[0].v._0_8_);
  std::__cxx11::string::~string((string *)local_420);
  anon_unknown_10::stlWriteUint32(&out,this->n);
  puVar5 = this->triangle;
  local_428 = this;
  for (iVar3 = 0; iVar3 < local_428->n; iVar3 = iVar3 + 1) {
    pfVar1 = (local_428->super_PointCloud).vertex;
    local_420[0].v[2] = pfVar1[(long)(int)*puVar5 * 3 + 2];
    local_420[0].v._0_8_ = *(undefined8 *)(pfVar1 + (long)(int)*puVar5 * 3);
    local_438.v[2] = pfVar1[(long)(int)puVar5[1] * 3 + 2];
    local_438.v._0_8_ = *(undefined8 *)(pfVar1 + (long)(int)puVar5[1] * 3);
    local_448.v[2] = pfVar1[(long)(int)puVar5[2] * 3 + 2];
    local_448.v._0_8_ = *(undefined8 *)(pfVar1 + (long)(int)puVar5[2] * 3);
    gmath::SVector<float,_3>::operator-(&local_3fc,&local_438);
    gmath::SVector<float,_3>::operator-(&local_3f0,&local_448);
    gmath::cross<float>((gmath *)&vn,&local_3fc,&local_3f0);
    s = gmath::norm<float,3>((SVector<float,_3> *)&vn);
    if (0.0 < s) {
      gmath::SVector<float,_3>::operator/=((SVector<float,_3> *)&vn,s);
    }
    anon_unknown_10::stlWriteVector3f(&out,&vn);
    anon_unknown_10::stlWriteVector3f(&out,local_420);
    anon_unknown_10::stlWriteVector3f(&out,&local_438);
    anon_unknown_10::stlWriteVector3f(&out,&local_448);
    cVar4 = (char)&out;
    std::ostream::put(cVar4);
    std::ostream::put(cVar4);
    puVar5 = puVar5 + 3;
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&header);
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Mesh::saveSTL(const char *name) const
{
  std::ofstream out;

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);

  // write header with camera definition

  std::ostringstream header;

  header << "campose=";
  gmath::Vector6d pose=gmath::getPose(getDefCameraR(), getDefCameraT());
  header << std::setprecision(5) << pose;

  while (header.tellp() < 80) header << ' ';

  out.write(header.str().c_str(), 80);

  // write number of triangles

  stlWriteUint32(out, static_cast<uint32_t>(n));

  unsigned int *tp=triangle;
  for (int i=0; i<n; i++)
  {
    // get vertices

    gmath::Vector3f v0=getVertex(tp[0]);
    gmath::Vector3f v1=getVertex(tp[1]);
    gmath::Vector3f v2=getVertex(tp[2]);

    // compute normal of triangle

    gmath::Vector3f vn=gmath::cross(v1-v0, v2-v0);
    float len=gmath::norm(vn);

    if (len > 0)
    {
      vn/=len;
    }

    // store normal

    stlWriteVector3f(out, vn);

    // store vertices

    stlWriteVector3f(out, v0);
    stlWriteVector3f(out, v1);
    stlWriteVector3f(out, v2);

    // store padding

    stlWriteUint16(out, 0);

    tp+=3;
  }

  out.close();
}